

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

void __thiscall VRle::operator&=(VRle *this,VRle *o)

{
  bool bVar1;
  size_t in_RCX;
  Span *__n;
  int iVar2;
  vcow_ptr<VRle::Data> *in_RSI;
  vcow_ptr<VRle::Data> *pvVar3;
  vcow_ptr<VRle::Data> *in_RDI;
  undefined1 auVar4 [16];
  View VVar5;
  View VVar6;
  Data *in_stack_000007d0;
  View in_stack_000007d8;
  View in_stack_000007e8;
  Data *pDVar7;
  Data *in_stack_ffffffffffffffc0;
  Data *this_00;
  Data *in_stack_ffffffffffffffd0;
  
  pvVar3 = in_RSI;
  bVar1 = empty((VRle *)0x12399d);
  iVar2 = (int)pvVar3;
  if (!bVar1) {
    bVar1 = empty((VRle *)0x1239b2);
    if (bVar1) {
      reset((VRle *)0x1239c2);
    }
    else {
      _ZTWL14Scratch_Object();
      Data::reset(in_stack_ffffffffffffffd0);
      auVar4 = _ZTWL14Scratch_Object();
      pDVar7 = auVar4._0_8_;
      vcow_ptr<VRle::Data>::read(in_RDI,iVar2,auVar4._8_8_,in_RCX);
      VVar5 = Data::view(in_stack_ffffffffffffffc0);
      vcow_ptr<VRle::Data>::read(in_RSI,iVar2,(void *)VVar5._size,in_RCX);
      VVar6 = Data::view(in_stack_ffffffffffffffc0);
      iVar2 = (int)VVar5._data;
      __n = VVar6._data;
      Data::opIntersect(in_stack_000007d0,in_stack_000007e8,in_stack_000007d8);
      auVar4 = _ZTWL14Scratch_Object();
      this_00 = auVar4._0_8_;
      vcow_ptr<VRle::Data>::write(in_RDI,iVar2,auVar4._8_8_,(size_t)__n);
      Data::operator=(this_00,pDVar7);
    }
  }
  return;
}

Assistant:

void VRle::operator&=(const VRle &o)
{
    if (empty()) return;
    if (o.empty()) {
        reset();
        return;
    }
    Scratch_Object.reset();
    Scratch_Object.opIntersect(d.read().view(), o.d.read().view());
    d.write() = Scratch_Object;
}